

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[47],char_const*,char[15],char[26],unsigned_int,char[10],std::__cxx11::string,char[45],char_const*,char[3],std::__cxx11::string,char[2]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [47],char **RestArgs,char (*RestArgs_1) [15],char (*RestArgs_2) [26]
               ,uint *RestArgs_3,char (*RestArgs_4) [10],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_5,
               char (*RestArgs_6) [45],char **RestArgs_7,char (*RestArgs_8) [3],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_9,
               char (*RestArgs_10) [2])

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  FormatStrSS<std::__cxx11::stringstream,char_const*>(ss,RestArgs);
  FormatStrSS<std::__cxx11::stringstream,char[15],char[26],unsigned_int,char[10],std::__cxx11::string,char[45],char_const*,char[3],std::__cxx11::string,char[2]>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,RestArgs_7,
             RestArgs_8,RestArgs_9,RestArgs_10);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}